

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEdit::keyPressEvent(QPlainTextEdit *this,QKeyEvent *e)

{
  QPlainTextEditPrivate *this_00;
  SliderAction action;
  bool bVar1;
  TextInteractionFlags TVar2;
  uint uVar3;
  int iVar4;
  MoveMode moveMode;
  MoveOperation op;
  SliderAction SStack_30;
  
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  TVar2 = QWidgetTextControl::textInteractionFlags((QWidgetTextControl *)this_00->control);
  if (((uint)TVar2.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i & 2) != 0) {
    bVar1 = ::operator==(e,SelectPreviousPage);
    if (bVar1) {
      e[0xc] = (QKeyEvent)0x1;
      op = Up;
    }
    else {
      bVar1 = ::operator==(e,SelectNextPage);
      if (!bVar1) goto LAB_0045a3ab;
      e[0xc] = (QKeyEvent)0x1;
      op = Down;
    }
    moveMode = KeepAnchor;
    goto LAB_0045a421;
  }
LAB_0045a3ab:
  if (((uint)TVar2.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x12) != 0) {
    bVar1 = ::operator==(e,MoveToPreviousPage);
    if (bVar1) {
      e[0xc] = (QKeyEvent)0x1;
      op = Up;
    }
    else {
      bVar1 = ::operator==(e,MoveToNextPage);
      if (!bVar1) goto LAB_0045a430;
      e[0xc] = (QKeyEvent)0x1;
      op = Down;
    }
    moveMode = MoveAnchor;
LAB_0045a421:
    QPlainTextEditPrivate::pageUpDown(this_00,op,moveMode,true);
    return;
  }
LAB_0045a430:
  if (((uint)TVar2.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
    QPlainTextEditPrivate::sendControlEvent(this_00,(QEvent *)e);
    return;
  }
  if (*(int *)(e + 0x40) == 0x20) {
    e[0xc] = (QKeyEvent)0x1;
    uVar3 = QKeyEvent::modifiers();
    if ((uVar3 >> 0x19 & 1) == 0) {
      SStack_30 = SliderPageStepAdd;
    }
    else {
      SStack_30 = SliderPageStepSub;
    }
    QAbstractSlider::triggerAction
              (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,SStack_30)
    ;
    return;
  }
  QPlainTextEditPrivate::sendControlEvent(this_00,(QEvent *)e);
  if (e[0xc] == (QKeyEvent)0x0) {
    iVar4 = QKeyEvent::modifiers();
    if (iVar4 == 0) {
      if (*(int *)(e + 0x40) == 0x1000010) {
        action = SliderToMinimum;
      }
      else {
        if (*(int *)(e + 0x40) != 0x1000011) goto LAB_0045a4ca;
        action = SliderToMaximum;
      }
      QAbstractSlider::triggerAction
                (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,action);
      e[0xc] = (QKeyEvent)0x1;
    }
  }
LAB_0045a4ca:
  if (e[0xc] != (QKeyEvent)0x0) {
    return;
  }
  QAbstractScrollArea::keyPressEvent((QAbstractScrollArea *)this,e);
  return;
}

Assistant:

void QPlainTextEdit::keyPressEvent(QKeyEvent *e)
{
    Q_D(QPlainTextEdit);

#ifdef QT_KEYPAD_NAVIGATION
    switch (e->key()) {
        case Qt::Key_Select:
            if (QApplicationPrivate::keypadNavigationEnabled()) {
                if (!(d->control->textInteractionFlags() & Qt::LinksAccessibleByKeyboard))
                    setEditFocus(!hasEditFocus());
                else {
                    if (!hasEditFocus())
                        setEditFocus(true);
                    else {
                        QTextCursor cursor = d->control->textCursor();
                        QTextCharFormat charFmt = cursor.charFormat();
                        if (!cursor.hasSelection() || charFmt.anchorHref().isEmpty()) {
                            setEditFocus(false);
                        }
                    }
                }
            }
            break;
        case Qt::Key_Back:
        case Qt::Key_No:
            if (!QApplicationPrivate::keypadNavigationEnabled() || !hasEditFocus()) {
                e->ignore();
                return;
            }
            break;
        default:
            if (QApplicationPrivate::keypadNavigationEnabled()) {
                if (!hasEditFocus() && !(e->modifiers() & Qt::ControlModifier)) {
                    if (e->text()[0].isPrint()) {
                        setEditFocus(true);
                        clear();
                    } else {
                        e->ignore();
                        return;
                    }
                }
            }
            break;
    }
#endif

#ifndef QT_NO_SHORTCUT

    Qt::TextInteractionFlags tif = d->control->textInteractionFlags();

    if (tif & Qt::TextSelectableByKeyboard){
        if (e == QKeySequence::SelectPreviousPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Up, QTextCursor::KeepAnchor);
            return;
        } else if (e ==QKeySequence::SelectNextPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Down, QTextCursor::KeepAnchor);
            return;
        }
    }
    if (tif & (Qt::TextSelectableByKeyboard | Qt::TextEditable)) {
        if (e == QKeySequence::MoveToPreviousPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Up, QTextCursor::MoveAnchor);
            return;
        } else if (e == QKeySequence::MoveToNextPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Down, QTextCursor::MoveAnchor);
            return;
        }
    }

    if (!(tif & Qt::TextEditable)) {
        switch (e->key()) {
            case Qt::Key_Space:
                e->accept();
                if (e->modifiers() & Qt::ShiftModifier)
                    d->vbar->triggerAction(QAbstractSlider::SliderPageStepSub);
                else
                    d->vbar->triggerAction(QAbstractSlider::SliderPageStepAdd);
                break;
            default:
                d->sendControlEvent(e);
                if (!e->isAccepted() && e->modifiers() == Qt::NoModifier) {
                    if (e->key() == Qt::Key_Home) {
                        d->vbar->triggerAction(QAbstractSlider::SliderToMinimum);
                        e->accept();
                    } else if (e->key() == Qt::Key_End) {
                        d->vbar->triggerAction(QAbstractSlider::SliderToMaximum);
                        e->accept();
                    }
                }
                if (!e->isAccepted()) {
                    QAbstractScrollArea::keyPressEvent(e);
                }
        }
        return;
    }
#endif // QT_NO_SHORTCUT

    d->sendControlEvent(e);
#ifdef QT_KEYPAD_NAVIGATION
    if (!e->isAccepted()) {
        switch (e->key()) {
            case Qt::Key_Up:
            case Qt::Key_Down:
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    // Cursor position didn't change, so we want to leave
                    // these keys to change focus.
                    e->ignore();
                    return;
                }
                break;
            case Qt::Key_Left:
            case Qt::Key_Right:
                if (QApplicationPrivate::keypadNavigationEnabled()
                        && QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
                    // Same as for Key_Up and Key_Down.
                    e->ignore();
                    return;
                }
                break;
            case Qt::Key_Back:
                if (!e->isAutoRepeat()) {
                    if (QApplicationPrivate::keypadNavigationEnabled()) {
                        if (document()->isEmpty()) {
                            setEditFocus(false);
                            e->accept();
                        } else if (!d->deleteAllTimer.isActive()) {
                            e->accept();
                            d->deleteAllTimer.start(750, this);
                        }
                    } else {
                        e->ignore();
                        return;
                    }
                }
                break;
            default: break;
        }
    }
#endif
}